

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

Variant * __thiscall spirv_cross::Variant::operator=(Variant *this,Variant *other)

{
  int iVar1;
  undefined4 extraout_var;
  IVariant *pIVar2;
  
  if (this != other) {
    if (this->holder != (IVariant *)0x0) {
      (**(code **)(*(long *)this->group->pools[this->type]._M_t.
                            super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                            .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false> + 0x10))();
    }
    pIVar2 = other->holder;
    if (pIVar2 == (IVariant *)0x0) {
      pIVar2 = (IVariant *)0x0;
    }
    else {
      iVar1 = (*pIVar2->_vptr_IVariant[2])
                        (pIVar2,(ObjectPoolBase *)
                                this->group->pools[other->type]._M_t.
                                super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                                .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>);
      pIVar2 = (IVariant *)CONCAT44(extraout_var,iVar1);
    }
    this->holder = pIVar2;
    this->type = other->type;
    this->allow_type_rewrite = other->allow_type_rewrite;
  }
  return this;
}

Assistant:

Variant &operator=(const Variant &other)
	{
//#define SPIRV_CROSS_COPY_CONSTRUCTOR_SANITIZE
#ifdef SPIRV_CROSS_COPY_CONSTRUCTOR_SANITIZE
		abort();
#endif
		if (this != &other)
		{
			if (holder)
				group->pools[type]->free_opaque(holder);

			if (other.holder)
				holder = other.holder->clone(group->pools[other.type].get());
			else
				holder = nullptr;

			type = other.type;
			allow_type_rewrite = other.allow_type_rewrite;
		}
		return *this;
	}